

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

void __thiscall
dynet::FastLSTMBuilder::FastLSTMBuilder
          (FastLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Parameter PVar3;
  Parameter PVar4;
  Parameter PVar5;
  ulong uVar6;
  ulong uVar7;
  ParameterCollection *this_00;
  uint uVar8;
  initializer_list<dynet::Parameter> __l;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  ParameterInit local_168;
  undefined4 local_160;
  string local_158;
  ParameterCollection *local_138;
  uint local_12c;
  ParameterStorage *local_128;
  _func_int **local_120;
  undefined1 local_118 [72];
  ParameterStorage *local_d0;
  ParameterStorage *local_c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  ParameterCollectionStorage *local_88;
  ParameterCollection *pPStack_80;
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  *local_78;
  ulong local_70;
  ParameterStorage *local_68;
  ParameterStorage *local_60;
  ParameterStorage *local_58;
  ParameterStorage *local_50;
  ParameterStorage *local_48;
  ParameterStorage *local_40;
  ParameterStorage *local_38;
  
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__FastLSTMBuilder_005b4250;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  local_78 = &this->params;
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layers = layers;
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  local_12c = layers;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"fast-lstm-builder","");
  ParameterCollection::add_subcollection((ParameterCollection *)local_118,model,&local_158);
  std::__cxx11::string::_M_assign((string *)this_00);
  if ((ParameterCollection *)local_118 != this_00) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).name_cntr,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_118 + 0x20));
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).collec_name_cntr,&local_c0);
  }
  (this->local_model).storage = local_88;
  (this->local_model).parent = pPStack_80;
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_12c != 0) {
    uVar7 = 0;
    local_120 = (_func_int **)&PTR__ParameterInit_005b8ae0;
    local_138 = this_00;
    do {
      local_128 = (ParameterStorage *)CONCAT44(local_128._4_4_,input_dim);
      local_168._vptr_ParameterInit._4_4_ = input_dim;
      local_168._vptr_ParameterInit._0_4_ = hidden_dim;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_38 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = hidden_dim;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_40 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = 1;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_48 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_118._28_4_ = 1;
      local_118._32_4_ = 1;
      local_118._0_4_ = hidden_dim;
      local_168._vptr_ParameterInit = local_120;
      local_160 = 0;
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_50 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,&local_168,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = local_128._0_4_;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_58 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = hidden_dim;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_60 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = 1;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_118._28_4_ = 1;
      local_118._32_4_ = 1;
      local_168._vptr_ParameterInit = local_120;
      local_160 = 0;
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_68 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)local_118,&local_168,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = local_128._0_4_;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar6 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      local_128 = PVar3.p;
      local_70 = uVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_168._vptr_ParameterInit._4_4_ = hidden_dim;
      local_118._28_4_ = 0;
      local_118._32_4_ = 1;
      lVar2 = 0;
      do {
        uVar7 = (ulong)(uint)local_118._28_4_;
        local_118._28_4_ = local_118._28_4_ + 1;
        *(undefined4 *)(local_118 + uVar7 * 4) =
             *(undefined4 *)((long)&local_168._vptr_ParameterInit + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      PVar4 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_118,0.0,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_118._28_4_ = 1;
      local_118._32_4_ = 1;
      local_168._vptr_ParameterInit = local_120;
      local_160 = 0;
      local_158._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      PVar5 = ParameterCollection::add_parameters
                        (this_00,(Dim *)local_118,&local_168,&local_158,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar1) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_118._0_8_ = local_38;
      local_118._8_8_ = local_40;
      local_118._16_8_ = local_48;
      local_118._24_4_ = SUB84(local_50,0);
      local_118._28_4_ = (undefined4)((ulong)local_50 >> 0x20);
      local_118._32_4_ = SUB84(local_58,0);
      local_118._36_4_ = (undefined4)((ulong)local_58 >> 0x20);
      local_118._40_8_ = local_60;
      local_118._48_8_ = local_128;
      local_118._56_8_ = local_68;
      __l._M_len = 0xb;
      __l._M_array = (iterator)local_118;
      local_118._64_8_ = PVar3;
      local_d0 = PVar4.p;
      local_c8 = PVar5.p;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
                ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&local_158,__l,
                 (allocator_type *)&local_168);
      this_00 = local_138;
      std::
      vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
      ::push_back(local_78,(value_type *)&local_158);
      uVar7 = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
      input_dim = hidden_dim;
    } while (uVar8 != local_12c);
  }
  return;
}

Assistant:

FastLSTMBuilder::FastLSTMBuilder(unsigned layers,
                                 unsigned input_dim,
                                 unsigned hidden_dim,
                                 ParameterCollection& model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("fast-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2i = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2i = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2o = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_c2o = local_model.add_parameters({hidden_dim, 1});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2c = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}